

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

string * __thiscall
cmFilePathChecksum::get(string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath)

{
  bool bVar1;
  ulong uVar2;
  reference input;
  size_type len;
  cmBase32Encoder local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  cmCryptoHash local_128;
  undefined1 local_118 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  string local_e0;
  string *local_c0;
  string *pDir;
  size_t ii;
  string parentDir;
  undefined1 local_80 [8];
  string fileReal;
  string relSeed;
  string relPath;
  string *filePath_local;
  cmFilePathChecksum *this_local;
  
  std::__cxx11::string::string((string *)(relSeed.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fileReal.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetRealPath((string *)local_80,filePath,(string *)0x0);
  std::__cxx11::string::string((string *)&ii);
  pDir = (string *)0x0;
  do {
    if (pDir == (string *)0x4) {
LAB_00830bcb:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)(fileReal.field_2._M_local_buf + 8),"FileSystemRoot");
        cmsys::SystemTools::SplitPathRootComponent((string *)local_80,(string *)&ii);
      }
      cmsys::SystemTools::GetParentDirectory
                ((string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_80);
      cmsys::SystemTools::RelativePath
                (&local_e0,(string *)&ii,
                 (string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(relSeed.field_2._M_local_buf + 8),(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string
                ((string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&ii);
      std::__cxx11::string::~string((string *)local_80);
      cmCryptoHash::cmCryptoHash(&local_128,AlgoSHA256);
      std::operator+(&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileReal.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relSeed.field_2 + 8));
      cmCryptoHash::ByteHashString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,&local_128,
                 &local_148);
      std::__cxx11::string::~string((string *)&local_148);
      cmCryptoHash::~cmCryptoHash(&local_128);
      cmBase32Encoder::cmBase32Encoder(&local_149);
      input = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,0);
      len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
      cmBase32Encoder::encodeString_abi_cxx11_(__return_storage_ptr__,&local_149,input,len,false);
      cmBase32Encoder::~cmBase32Encoder(&local_149);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
      std::__cxx11::string::~string((string *)(fileReal.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(relSeed.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    local_c0 = &this->parentDirs[(long)pDir].first;
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_80,local_c0), bVar1)) {
      std::__cxx11::string::operator=
                ((string *)(fileReal.field_2._M_local_buf + 8),
                 (string *)&this->parentDirs[(long)pDir].second);
      std::__cxx11::string::operator=((string *)&ii,(string *)local_c0);
      goto LAB_00830bcb;
    }
    pDir = (string *)&pDir->field_0x1;
  } while( true );
}

Assistant:

std::string cmFilePathChecksum::get(const std::string& filePath) const
{
  std::string relPath;
  std::string relSeed;
  {
    const std::string fileReal = cmsys::SystemTools::GetRealPath(filePath);
    std::string parentDir;
    // Find closest project parent directory
    for (size_t ii = 0; ii != numParentDirs; ++ii) {
      const std::string& pDir = parentDirs[ii].first;
      if (!pDir.empty() &&
          cmsys::SystemTools::IsSubDirectory(fileReal, pDir)) {
        relSeed = parentDirs[ii].second;
        parentDir = pDir;
        break;
      }
    }
    // Use file system root as fallback parent directory
    if (parentDir.empty()) {
      relSeed = "FileSystemRoot";
      cmsys::SystemTools::SplitPathRootComponent(fileReal, &parentDir);
    }
    // Calculate relative path from project parent directory
    relPath = cmsys::SystemTools::RelativePath(
      parentDir, cmsys::SystemTools::GetParentDirectory(fileReal));
  }

  // Calculate the file ( seed + relative path ) binary checksum
  std::vector<unsigned char> hashBytes =
    cmCryptoHash(cmCryptoHash::AlgoSHA256).ByteHashString(relSeed + relPath);

  // Convert binary checksum to string
  return cmBase32Encoder().encodeString(&hashBytes[0], hashBytes.size(),
                                        false);
}